

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
Generator_hodgkinHuxleySquidAxonModel1952WithVariousExternalVariables_Test::TestBody
          (Generator_hodgkinHuxleySquidAxonModel1952WithVariousExternalVariables_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__r;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  AssertHelper local_4e8 [8];
  Message local_4e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  allocator<char> local_4b1;
  string local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_450 [8];
  Message local_448 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator<char> local_419;
  string local_418 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_3;
  Message local_3c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  allocator<char> local_391;
  string local_390 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_2;
  string local_338 [32];
  undefined1 local_318 [8];
  GeneratorProfilePtr profile;
  GeneratorPtr generator;
  AnalyserModelPtr analyserModel;
  Message local_2e0 [8];
  unsigned_long local_2d8 [2];
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_1;
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  string local_278 [32];
  shared_ptr<libcellml::Component> local_258;
  shared_ptr<libcellml::Variable> local_248;
  shared_ptr<libcellml::AnalyserExternalVariable> local_238;
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [32];
  shared_ptr<libcellml::Component> local_1d8;
  shared_ptr<libcellml::Variable> local_1c8;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [32];
  shared_ptr<libcellml::Component> local_168;
  shared_ptr<libcellml::Variable> local_158;
  undefined1 local_148 [8];
  AnalyserExternalVariablePtr external_sodium_channel_i_Na;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  shared_ptr<libcellml::Component> local_e8;
  undefined1 local_d8 [8];
  VariablePtr potassium_channel_n_gate_alpha_n;
  AnalyserPtr analyser;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Generator_hodgkinHuxleySquidAxonModel1952WithVariousExternalVariables_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x619,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  libcellml::Analyser::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"potassium_channel_n_gate",&local_109);
  libcellml::ComponentEntity::component((string *)&local_e8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"alpha_n",
             (allocator<char> *)
             ((long)&external_sodium_channel_i_Na.
                     super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_d8);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&external_sodium_channel_i_Na.
                     super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"sodium_channel",&local_189);
  libcellml::ComponentEntity::component((string *)&local_168,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"i_Na",&local_1b1);
  libcellml::Component::variable((string *)&local_158);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_158);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_168);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  peVar4 = std::
           __shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  libcellml::AnalyserExternalVariable::addDependency((shared_ptr *)peVar4);
  peVar4 = std::
           __shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"sodium_channel_h_gate",&local_1f9);
  libcellml::ComponentEntity::component((string *)&local_1d8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"h",&local_221);
  libcellml::Component::variable((string *)&local_1c8);
  libcellml::AnalyserExternalVariable::addDependency((shared_ptr *)peVar4);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1c8);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1d8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  peVar5 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&potassium_channel_n_gate_alpha_n.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"membrane",&local_279);
  libcellml::ComponentEntity::component((string *)&local_258,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"V",&local_2a1);
  libcellml::Component::variable((string *)&local_248);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_238);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar5);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr(&local_238);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_248);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_258);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  peVar5 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&potassium_channel_n_gate_alpha_n.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&potassium_channel_n_gate_alpha_n.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&gtest_ar_1.message_);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar5);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserExternalVariable> *)&gtest_ar_1.message_);
  peVar5 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&potassium_channel_n_gate_alpha_n.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar5);
  local_2d8[1] = 0;
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &potassium_channel_n_gate_alpha_n.
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_2d8[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2c8,"size_t(0)","analyser->errorCount()",local_2d8 + 1,
             local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x628,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,local_2e0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    testing::Message::~Message(local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &potassium_channel_n_gate_alpha_n.
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  peVar6 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&profile.
                            super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Generator::setModel((shared_ptr *)peVar6);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::profile();
  peVar7 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"model.external.h",(allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  libcellml::GeneratorProfile::setInterfaceFileNameString((string *)peVar7);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_390,"generator/hodgkin_huxley_squid_axon_model_1952/model.external.h",&local_391)
  ;
  fileContents((string *)&local_370);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_350,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.external.h\")",
             "generator->interfaceCode()",&local_370,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x633,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"generator/hodgkin_huxley_squid_axon_model_1952/model.external.c",&local_419)
  ;
  fileContents((string *)&local_3f8);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_3d8,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.external.c\")",
             "generator->implementationCode()",&local_3f8,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(local_448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              (local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x634,pcVar2);
    testing::internal::AssertHelper::operator=(local_450,local_448);
    testing::internal::AssertHelper::~AssertHelper(local_450);
    testing::Message::~Message(local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  __r = &gtest_ar_4.message_;
  libcellml::GeneratorProfile::create((Profile)__r);
  std::shared_ptr<libcellml::GeneratorProfile>::operator=
            ((shared_ptr<libcellml::GeneratorProfile> *)local_318,
             (shared_ptr<libcellml::GeneratorProfile> *)__r);
  std::shared_ptr<libcellml::GeneratorProfile>::~shared_ptr
            ((shared_ptr<libcellml::GeneratorProfile> *)__r);
  peVar6 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&profile.
                            super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Generator::setProfile((shared_ptr *)peVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b0,"generator/hodgkin_huxley_squid_axon_model_1952/model.external.py",&local_4b1
            );
  fileContents((string *)&local_490);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_470,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.external.py\")",
             "generator->implementationCode()",&local_490,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(local_4e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              (local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x63a,pcVar2);
    testing::internal::AssertHelper::operator=(local_4e8,local_4e0);
    testing::internal::AssertHelper::~AssertHelper(local_4e8);
    testing::Message::~Message(local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  std::shared_ptr<libcellml::GeneratorProfile>::~shared_ptr
            ((shared_ptr<libcellml::GeneratorProfile> *)local_318);
  std::shared_ptr<libcellml::Generator>::~shared_ptr
            ((shared_ptr<libcellml::Generator> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::AnalyserModel>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserModel> *)
             &generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserExternalVariable> *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d8);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr
            ((shared_ptr<libcellml::Analyser> *)
             &potassium_channel_n_gate_alpha_n.
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Generator, hodgkinHuxleySquidAxonModel1952WithVariousExternalVariables)
{
    // Generate some code for the HH52 model with sodium_channel.i_Na as an
    // external variable which has a dependency on
    // potassium_channel_n_gate.alpha_n, another external variable (which is
    // going to be declared after i_Na, so that it ends up with a higher index,
    // meaning that it would normally be computed after i_Na if there was no
    // such a dependency), and on sodium_channel_h_gate.h, a state variable, so
    // that i_Na ends up being computed both in the computeRates() and
    // computeVariables() methods.

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();
    auto potassium_channel_n_gate_alpha_n = model->component("potassium_channel_n_gate")->variable("alpha_n");
    auto external_sodium_channel_i_Na = libcellml::AnalyserExternalVariable::create(model->component("sodium_channel")->variable("i_Na"));

    external_sodium_channel_i_Na->addDependency(potassium_channel_n_gate_alpha_n);
    external_sodium_channel_i_Na->addDependency(model->component("sodium_channel_h_gate")->variable("h"));

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V")));
    analyser->addExternalVariable(external_sodium_channel_i_Na);
    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(potassium_channel_n_gate_alpha_n));

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    auto profile = generator->profile();

    profile->setInterfaceFileNameString("model.external.h");

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.external.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.external.c"), generator->implementationCode());

    profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.external.py"), generator->implementationCode());
}